

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O2

void duckdb::InsertToken(tokenType insert_type,idx_t insert_pos,
                        vector<duckdb::highlightToken,_true> *tokens)

{
  ulong uVar1;
  reference pvVar2;
  ulong __n;
  ulong __n_00;
  vector<duckdb::highlightToken,_true> new_tokens;
  value_type local_48;
  
  new_tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  new_tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::reserve
            (&new_tokens.
              super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
             ((long)(tokens->
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(tokens->
                   super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18 + 1);
  __n_00 = 0;
  do {
    uVar1 = ((long)(tokens->
                   super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(tokens->
                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    __n = __n_00;
    if (uVar1 <= __n_00) {
LAB_001f186b:
      for (; __n < (ulong)(((long)(tokens->
                                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                  ).
                                  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(tokens->
                                 super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                 ).
                                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18); __n = __n + 1)
      {
        pvVar2 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n);
        ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                  (&new_tokens.
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                   pvVar2);
      }
      if (uVar1 <= __n_00) {
        local_48.search_match = false;
        local_48.type = insert_type;
        local_48.start = insert_pos;
        ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                  (&new_tokens.
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                   &local_48);
      }
      ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::_M_move_assign
                (&tokens->
                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                 (_Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                 &new_tokens);
      ::std::_Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::
      ~_Vector_base((_Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *
                    )&new_tokens);
      return;
    }
    pvVar2 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n_00);
    if (pvVar2->start == insert_pos) {
      local_48.search_match = false;
      local_48.type = insert_type;
      local_48.start = insert_pos;
      ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                (&new_tokens.
                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                 &local_48);
      __n = __n_00 + 1;
      if (((ulong)(((long)(tokens->
                          super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                          ).
                          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(tokens->
                         super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                         ).
                         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= __n) ||
         (pvVar2 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n),
         insert_pos + 1 < pvVar2->start)) {
        local_48.start = insert_pos + 1;
        pvVar2 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n_00);
        local_48.type = pvVar2->type;
        local_48.search_match = false;
        ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                  (&new_tokens.
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                   &local_48);
      }
      goto LAB_001f186b;
    }
    pvVar2 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n_00);
    if (insert_pos < pvVar2->start) {
      local_48.search_match = false;
      local_48.type = insert_type;
      local_48.start = insert_pos;
      ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                (&new_tokens.
                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                 &local_48);
      pvVar2 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n_00);
      ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                (&new_tokens.
                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                 pvVar2);
      __n = __n_00 + 1;
      goto LAB_001f186b;
    }
    pvVar2 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n_00);
    ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
              (&new_tokens.
                super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,pvVar2
              );
    __n_00 = __n_00 + 1;
  } while( true );
}

Assistant:

void InsertToken(tokenType insert_type, idx_t insert_pos, vector<highlightToken> &tokens) {
	vector<highlightToken> new_tokens;
	new_tokens.reserve(tokens.size() + 1);
	idx_t i;
	bool found = false;
	for (i = 0; i < tokens.size(); i++) {
		// find the exact position where we need to insert the token
		if (tokens[i].start == insert_pos) {
			// this token is exactly at this render position

			// insert highlighting for the bracket
			highlightToken token;
			token.start = insert_pos;
			token.type = insert_type;
			token.search_match = false;
			new_tokens.push_back(token);

			// now we need to insert the other token ONLY if the other token is not immediately following this one
			if (i + 1 >= tokens.size() || tokens[i + 1].start > insert_pos + 1) {
				token.start = insert_pos + 1;
				token.type = tokens[i].type;
				token.search_match = false;
				new_tokens.push_back(token);
			}
			i++;
			found = true;
			break;
		} else if (tokens[i].start > insert_pos) {
			// the next token is AFTER the render position
			// insert highlighting for the bracket
			highlightToken token;
			token.start = insert_pos;
			token.type = insert_type;
			token.search_match = false;
			new_tokens.push_back(token);

			// now just insert the next token
			new_tokens.push_back(tokens[i]);
			i++;
			found = true;
			break;
		} else {
			// insert the token
			new_tokens.push_back(tokens[i]);
		}
	}
	// copy over the remaining tokens
	for (; i < tokens.size(); i++) {
		new_tokens.push_back(tokens[i]);
	}
	if (!found) {
		// token was not added - add it to the end
		highlightToken token;
		token.start = insert_pos;
		token.type = insert_type;
		token.search_match = false;
		new_tokens.push_back(token);
	}
	tokens = std::move(new_tokens);
}